

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

string * nite::strRemoveEndline(string *__return_storage_ptr__,string *Input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  string local_70;
  size_type *local_50;
  string Buffer;
  
  local_50 = &Buffer._M_string_length;
  Buffer._M_dataplus._M_p = (pointer)0x0;
  Buffer._M_string_length._0_1_ = 0;
  if (Input->_M_string_length != 0) {
    strAt(&local_70,Input,(int)Input->_M_string_length - 1);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    do {
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar4 != 0) break;
      }
      if (Input->_M_string_length == 0) break;
      std::__cxx11::string::erase((ulong)Input,Input->_M_string_length - 1);
      if (Input->_M_string_length == 0) break;
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,0,(ulong)Buffer._M_dataplus._M_p,'\x01')
      ;
    } while( true );
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (Input->_M_dataplus)._M_p;
  paVar1 = &Input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&Input->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = Input->_M_string_length;
  (Input->_M_dataplus)._M_p = (pointer)paVar1;
  Input->_M_string_length = 0;
  (Input->field_2)._M_local_buf[0] = '\0';
  if (local_50 != &Buffer._M_string_length) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::strRemoveEndline(String Input){
	String Buffer;
	if (Input.length()>0){
		Buffer = nite::strAt(Input,Input.length()-1);
		while ( (Buffer=="\n" or Buffer=="\r" )  && Input.length()>0 ){
			Input.erase(Input.length()-1,1);
			if (Input.length()==0)
				break;
			Buffer = Input.at(Input.length()-1);
		}
	}
	return Input;
}